

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

void Abc_NtkDressPrintEquivs(Vec_Ptr_t *vRes)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *p;
  int local_20;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vClass;
  Vec_Ptr_t *vRes_local;
  
  for (Entry = 0; iVar1 = Vec_PtrSize(vRes), Entry < iVar1; Entry = Entry + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vRes,Entry);
    printf("Class %5d : ",(ulong)(uint)Entry);
    uVar2 = Vec_IntSize(p);
    printf("Num =%5d    ",(ulong)uVar2);
    for (local_20 = 0; iVar1 = Vec_IntSize(p), local_20 < iVar1; local_20 = local_20 + 1) {
      iVar1 = Vec_IntEntry(p,local_20);
      uVar2 = Abc_ObjEquivId2ObjId(iVar1);
      iVar3 = Abc_ObjEquivId2Polar(iVar1);
      uVar4 = 0x2b;
      if (iVar3 != 0) {
        uVar4 = 0x2d;
      }
      uVar5 = Abc_ObjEquivId2NtkId(iVar1);
      printf("%5d%c%d ",(ulong)uVar2,(ulong)uVar4,(ulong)uVar5);
    }
    printf("\n");
  }
  return;
}

Assistant:

void Abc_NtkDressPrintEquivs( Vec_Ptr_t * vRes )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        printf( "Class %5d : ", i );
        printf( "Num =%5d    ", Vec_IntSize(vClass) );
        Vec_IntForEachEntry( vClass, Entry, k )
            printf( "%5d%c%d ", 
                Abc_ObjEquivId2ObjId(Entry), 
                Abc_ObjEquivId2Polar(Entry)? '-':'+', 
                Abc_ObjEquivId2NtkId(Entry) );
        printf( "\n" );
    }
}